

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,char_const*,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point,digit_grouping<char> *grouping)

{
  basic_appender<char> bVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  undefined1 *local_248;
  long lStack_240;
  undefined8 local_238;
  code *local_230;
  undefined1 local_228 [512];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    bVar1 = write_significand<fmt::v11::basic_appender<char>,char>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (basic_appender<char>)bVar1.container;
  }
  lStack_240 = 0;
  local_230 = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_238 = 500;
  local_248 = local_228;
  write_significand<fmt::v11::basic_appender<char>,char>
            ((buffer<char> *)&local_248,significand,significand_size,integral_size,decimal_point);
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_248;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_248 + (uint)integral_size,local_248 + lStack_240,out);
    if (local_248 != local_228) {
      free(local_248);
    }
    return (basic_appender<char>)bVar1.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
              ,0x1b6,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}